

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int CmdCommandAutoTuner(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  char *pcVar5;
  uint local_44;
  char *local_40;
  
  pcVar5 = (char *)0x0;
  Extra_UtilGetoptReset();
  local_44 = 3;
  local_40 = (char *)0x0;
  bVar1 = false;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"NCFvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (iVar3 == -1) {
        if (pcVar5 == (char *)0x0) {
          pcVar5 = "File containing configuration for autotuning is not given.\n";
        }
        else if (local_40 == (char *)0x0) {
          pcVar5 = "File contining list of files for autotuning is not given.\n";
        }
        else {
          pFVar4 = (FILE *)Io_FileOpen(pcVar5,"open_path","rb",0);
          if (pFVar4 == (FILE *)0x0) {
            Abc_Print(-2,"Cannot open configuration file \"%s\". ",pcVar5);
          }
          else {
            fclose(pFVar4);
            pFVar4 = (FILE *)Io_FileOpen(local_40,"open_path","rb",0);
            if (pFVar4 != (FILE *)0x0) {
              fclose(pFVar4);
              Cmd_RunAutoTuner(pcVar5,local_40,local_44);
              return 0;
            }
            Abc_Print(-2,"Cannot open the file list \"%s\". ",local_40);
            pcVar5 = local_40;
          }
          pcVar5 = Extra_FileGetSimilarName(pcVar5,".c",".s",".scr",".script",(char *)0x0);
          if (pcVar5 != (char *)0x0) {
            Abc_Print(-2,"Did you mean \"%s\"?",pcVar5);
          }
          pcVar5 = "\n";
        }
        goto LAB_006ca952;
      }
      if (iVar3 != 0x43) break;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n"
        ;
LAB_006ca8c3:
        Abc_Print(-1,pcVar5);
        goto LAB_006ca8cd;
      }
      pcVar5 = argv[globalUtilOptind];
LAB_006ca782:
      globalUtilOptind = globalUtilOptind + 1;
    }
    if (iVar3 == 0x46) {
      if (globalUtilOptind < argc) {
        local_40 = argv[globalUtilOptind];
        goto LAB_006ca782;
      }
      pcVar5 = "Command line switch \"-F\" should be followed by a string (possibly in quotes).\n";
      goto LAB_006ca8c3;
    }
    if (iVar3 != 0x4e) break;
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_006ca8c3;
    }
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < (int)local_44);
LAB_006ca8cd:
  Abc_Print(-2,"usage: autotuner [-N num] [-C file] [-F file] [-vh]\n");
  Abc_Print(-2,"\t         performs autotuning\n");
  Abc_Print(-2,"\t-N num : the number of concurrent jobs including the controler [default = %d]\n",
            (ulong)local_44);
  Abc_Print(-2,"\t-C cmd : configuration file with settings for autotuning\n");
  Abc_Print(-2,"\t-F cmd : list of AIGER files to be used for autotuning\n");
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar5 = "\t-h     : print the command usage\n";
LAB_006ca952:
  Abc_Print(-2,pcVar5);
  return 1;
}

Assistant:

int CmdCommandAutoTuner( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Cmd_RunAutoTuner( char * pConfig, char * pFileList, int nCores );
    FILE * pFile;
    char * pFileConf = NULL;
    char * pFileList = NULL;
    char * pFileName;
    int c, nCores    =  3;
    int fVerbose     =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCores = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCores < 0 ) 
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n" );
                goto usage;
            }
            pFileConf = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a string (possibly in quotes).\n" );
                goto usage;
            }
            pFileList = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pFileConf == NULL )
    {
        Abc_Print( -2, "File containing configuration for autotuning is not given.\n" );
        return 1;
    }
    if ( pFileList == NULL )
    {
        Abc_Print( -2, "File contining list of files for autotuning is not given.\n" );
        return 1;
    }
    // get the input file name
    pFileName = pFileConf;
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "rb", 0 )) == NULL )
//    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        Abc_Print( -2, "Cannot open configuration file \"%s\". ", pFileName );
        if (( pFileName = Extra_FileGetSimilarName( pFileName, ".c", ".s", ".scr", ".script", NULL ) ))
            Abc_Print( -2, "Did you mean \"%s\"?", pFileName );
        Abc_Print( -2, "\n" );
        return 1;
    }
    fclose( pFile );
    // get the input file name
    pFileName = pFileList;
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "rb", 0 )) == NULL )
//    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        Abc_Print( -2, "Cannot open the file list \"%s\". ", pFileName );
        if (( pFileName = Extra_FileGetSimilarName( pFileName, ".c", ".s", ".scr", ".script", NULL ) ))
            Abc_Print( -2, "Did you mean \"%s\"?", pFileName );
        Abc_Print( -2, "\n" );
        return 1;
    }
    fclose( pFile );
    // run commands
    Cmd_RunAutoTuner( pFileConf, pFileList, nCores );
    return 0;

usage:
    Abc_Print( -2, "usage: autotuner [-N num] [-C file] [-F file] [-vh]\n" );
    Abc_Print( -2, "\t         performs autotuning\n" );
    Abc_Print( -2, "\t-N num : the number of concurrent jobs including the controler [default = %d]\n", nCores );
    Abc_Print( -2, "\t-C cmd : configuration file with settings for autotuning\n" );
    Abc_Print( -2, "\t-F cmd : list of AIGER files to be used for autotuning\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}